

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O3

Abc_Cex_t * Bmcg_ManGenerateCex(Bmcg_Man_t *p,int i,int f,int s)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  Abc_Cex_t *pAVar4;
  Gia_Man_t *pGVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  int nTruePos;
  long lVar8;
  
  pGVar5 = p->pGia;
  iVar3 = pGVar5->nRegs;
  nTruePos = pGVar5->vCos->nSize - iVar3;
  pAVar4 = Abc_CexMakeTriv(iVar3,pGVar5->vCis->nSize - iVar3,nTruePos,f * nTruePos + i);
  pGVar5 = p->pFrames;
  pVVar6 = pGVar5->vCis;
  uVar7 = (ulong)(uint)pVVar6->nSize;
  if (pGVar5->nRegs < pVVar6->nSize) {
    lVar8 = 0;
    do {
      if ((int)uVar7 <= lVar8) {
LAB_00574e69:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = pVVar6->pArray[lVar8];
      if (((long)iVar3 < 0) || (pGVar5->nObjs <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar5->pObjs == (Gia_Obj_t *)0x0) {
        return pAVar4;
      }
      if ((p->vFr2Sat).nSize <= iVar3) goto LAB_00574e69;
      iVar3 = (p->vFr2Sat).pArray[iVar3];
      if ((0 < iVar3) && (iVar3 = bmcg_sat_solver_read_cex_varvalue(p->pSats[s],iVar3), iVar3 != 0))
      {
        uVar1 = (p->vCiMap).nSize;
        if (((int)uVar1 <= (int)(lVar8 * 2)) || (uVar7 = lVar8 * 2 | 1, uVar1 <= uVar7))
        goto LAB_00574e69;
        piVar2 = (p->vCiMap).pArray;
        iVar3 = p->pGia->nRegs;
        iVar3 = iVar3 + piVar2[lVar8 * 2] + (p->pGia->vCis->nSize - iVar3) * piVar2[uVar7];
        (&pAVar4[1].iPo)[iVar3 >> 5] = (&pAVar4[1].iPo)[iVar3 >> 5] | 1 << ((byte)iVar3 & 0x1f);
      }
      lVar8 = lVar8 + 1;
      pGVar5 = p->pFrames;
      pVVar6 = pGVar5->vCis;
      uVar7 = (ulong)pVVar6->nSize;
    } while (lVar8 < (long)(uVar7 - (long)pGVar5->nRegs));
  }
  return pAVar4;
}

Assistant:

Abc_Cex_t * Bmcg_ManGenerateCex( Bmcg_Man_t * p, int i, int f, int s )
{
    Abc_Cex_t * pCex = Abc_CexMakeTriv( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), Gia_ManPoNum(p->pGia), f*Gia_ManPoNum(p->pGia)+i );
    Gia_Obj_t * pObj;  int k;
    Gia_ManForEachPi( p->pFrames, pObj, k )
    {
        int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
        if ( iSatVar > 0 && bmcg_sat_solver_read_cex_varvalue(p->pSats[s], iSatVar) ) // 1 bit
        {
            int iCiId   = Vec_IntEntry( &p->vCiMap, 2*k+0 );
            int iFrame  = Vec_IntEntry( &p->vCiMap, 2*k+1 );
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p->pGia) + iFrame * Gia_ManPiNum(p->pGia) + iCiId );
        }
    }
    return pCex;
}